

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curve25519_64.h
# Opt level: O0

void fiat_25519_to_bytes(uint8_t *out1,uint64_t *arg1)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  uint8_t x91;
  uint8_t x90;
  uint64_t x89;
  uint8_t x88;
  uint64_t x87;
  uint8_t x86;
  uint64_t x85;
  uint8_t x84;
  uint64_t x83;
  uint8_t x82;
  uint64_t x81;
  uint8_t x80;
  uint64_t x79;
  uint8_t x78;
  uint8_t x77;
  uint64_t x76;
  uint8_t x75;
  uint64_t x74;
  uint8_t x73;
  uint64_t x72;
  uint8_t x71;
  uint64_t x70;
  uint8_t x69;
  uint64_t x68;
  uint8_t x67;
  uint64_t x66;
  fiat_25519_uint1 x65;
  uint8_t x64;
  uint64_t x63;
  uint8_t x62;
  uint64_t x61;
  uint8_t x60;
  uint64_t x59;
  uint8_t x58;
  uint64_t x57;
  uint8_t x56;
  uint64_t x55;
  uint8_t x54;
  uint64_t x53;
  uint8_t x52;
  uint64_t x51;
  uint8_t x50;
  uint8_t x49;
  uint64_t x48;
  uint8_t x47;
  uint64_t x46;
  uint8_t x45;
  uint64_t x44;
  uint8_t x43;
  uint64_t x42;
  uint8_t x41;
  uint64_t x40;
  uint8_t x39;
  uint64_t x38;
  uint8_t x37;
  uint8_t x36;
  uint64_t x35;
  uint8_t x34;
  uint64_t x33;
  uint8_t x32;
  uint64_t x31;
  uint8_t x30;
  uint64_t x29;
  uint8_t x28;
  uint64_t x27;
  uint8_t x26;
  uint64_t x25;
  uint64_t x24;
  uint64_t x23;
  uint64_t x22;
  uint64_t uStack_b8;
  fiat_25519_uint1 x21;
  uint64_t x20;
  uint64_t uStack_a8;
  fiat_25519_uint1 x19;
  uint64_t x18;
  uint64_t uStack_98;
  fiat_25519_uint1 x17;
  uint64_t x16;
  uint64_t uStack_88;
  fiat_25519_uint1 x15;
  uint64_t x14;
  ulong uStack_78;
  fiat_25519_uint1 x13;
  uint64_t x12;
  uint64_t x11;
  uint64_t uStack_60;
  fiat_25519_uint1 x10;
  uint64_t x9;
  uint64_t uStack_50;
  fiat_25519_uint1 x8;
  uint64_t x7;
  uint64_t uStack_40;
  fiat_25519_uint1 x6;
  uint64_t x5;
  uint64_t uStack_30;
  fiat_25519_uint1 x4;
  uint64_t x3;
  uint64_t uStack_20;
  fiat_25519_uint1 x2;
  uint64_t x1;
  uint64_t *arg1_local;
  uint8_t *out1_local;
  
  x1 = (uint64_t)arg1;
  arg1_local = (uint64_t *)out1;
  fiat_25519_subborrowx_u51
            (&stack0xffffffffffffffe0,(fiat_25519_uint1 *)((long)&x3 + 7),'\0',*arg1,0x7ffffffffffed
            );
  fiat_25519_subborrowx_u51
            (&stack0xffffffffffffffd0,(fiat_25519_uint1 *)((long)&x5 + 7),x3._7_1_,
             *(uint64_t *)(x1 + 8),0x7ffffffffffff);
  fiat_25519_subborrowx_u51
            (&stack0xffffffffffffffc0,(fiat_25519_uint1 *)((long)&x7 + 7),x5._7_1_,
             *(uint64_t *)(x1 + 0x10),0x7ffffffffffff);
  fiat_25519_subborrowx_u51
            (&stack0xffffffffffffffb0,(fiat_25519_uint1 *)((long)&x9 + 7),x7._7_1_,
             *(uint64_t *)(x1 + 0x18),0x7ffffffffffff);
  fiat_25519_subborrowx_u51
            (&stack0xffffffffffffffa0,(fiat_25519_uint1 *)((long)&x11 + 7),x9._7_1_,
             *(uint64_t *)(x1 + 0x20),0x7ffffffffffff);
  fiat_25519_cmovznz_u64(&x12,x11._7_1_,0,0xffffffffffffffff);
  fiat_25519_addcarryx_u51
            (&stack0xffffffffffffff88,(fiat_25519_uint1 *)((long)&x14 + 7),'\0',uStack_20,
             x12 & 0x7ffffffffffed);
  fiat_25519_addcarryx_u51
            (&stack0xffffffffffffff78,(fiat_25519_uint1 *)((long)&x16 + 7),x14._7_1_,uStack_30,
             x12 & 0x7ffffffffffff);
  fiat_25519_addcarryx_u51
            (&stack0xffffffffffffff68,(fiat_25519_uint1 *)((long)&x18 + 7),x16._7_1_,uStack_40,
             x12 & 0x7ffffffffffff);
  fiat_25519_addcarryx_u51
            (&stack0xffffffffffffff58,(fiat_25519_uint1 *)((long)&x20 + 7),x18._7_1_,uStack_50,
             x12 & 0x7ffffffffffff);
  fiat_25519_addcarryx_u51
            (&stack0xffffffffffffff48,(fiat_25519_uint1 *)((long)&x22 + 7),x20._7_1_,uStack_60,
             x12 & 0x7ffffffffffff);
  uVar1 = uStack_88 * 8 + (uStack_78 >> 0x30 & 0xff);
  uVar2 = uStack_98 * 0x40 + (uVar1 >> 0x30 & 0xff);
  uVar3 = uStack_a8 * 2 + (uVar2 >> 0x38);
  lVar4 = uStack_b8 * 0x10 + (uVar3 >> 0x30 & 0xff);
  *(char *)arg1_local = (char)uStack_78;
  *(char *)((long)arg1_local + 1) = (char)(uStack_78 >> 8);
  *(char *)((long)arg1_local + 2) = (char)(uStack_78 >> 0x10);
  *(char *)((long)arg1_local + 3) = (char)(uStack_78 >> 0x18);
  *(char *)((long)arg1_local + 4) = (char)(uStack_78 >> 0x20);
  *(char *)((long)arg1_local + 5) = (char)(uStack_78 >> 0x28);
  *(char *)((long)arg1_local + 6) = (char)uVar1;
  *(char *)((long)arg1_local + 7) = (char)(uVar1 >> 8);
  *(char *)(arg1_local + 1) = (char)(uVar1 >> 0x10);
  *(char *)((long)arg1_local + 9) = (char)(uVar1 >> 0x18);
  *(char *)((long)arg1_local + 10) = (char)(uVar1 >> 0x20);
  *(char *)((long)arg1_local + 0xb) = (char)(uVar1 >> 0x28);
  *(char *)((long)arg1_local + 0xc) = (char)uVar2;
  *(char *)((long)arg1_local + 0xd) = (char)(uVar2 >> 8);
  *(char *)((long)arg1_local + 0xe) = (char)(uVar2 >> 0x10);
  *(char *)((long)arg1_local + 0xf) = (char)(uVar2 >> 0x18);
  *(char *)(arg1_local + 2) = (char)(uVar2 >> 0x20);
  *(char *)((long)arg1_local + 0x11) = (char)(uVar2 >> 0x28);
  *(char *)((long)arg1_local + 0x12) = (char)(uVar2 >> 0x30);
  *(char *)((long)arg1_local + 0x13) = (char)uVar3;
  *(char *)((long)arg1_local + 0x14) = (char)(uVar3 >> 8);
  *(char *)((long)arg1_local + 0x15) = (char)(uVar3 >> 0x10);
  *(char *)((long)arg1_local + 0x16) = (char)(uVar3 >> 0x18);
  *(char *)((long)arg1_local + 0x17) = (char)(uVar3 >> 0x20);
  *(char *)(arg1_local + 3) = (char)(uVar3 >> 0x28);
  *(char *)((long)arg1_local + 0x19) = (char)lVar4;
  *(char *)((long)arg1_local + 0x1a) = (char)((ulong)lVar4 >> 8);
  *(char *)((long)arg1_local + 0x1b) = (char)((ulong)lVar4 >> 0x10);
  *(char *)((long)arg1_local + 0x1c) = (char)((ulong)lVar4 >> 0x18);
  *(char *)((long)arg1_local + 0x1d) = (char)((ulong)lVar4 >> 0x20);
  *(char *)((long)arg1_local + 0x1e) = (char)((ulong)lVar4 >> 0x28);
  *(char *)((long)arg1_local + 0x1f) = (char)((ulong)lVar4 >> 0x30);
  return;
}

Assistant:

static FIAT_25519_FIAT_INLINE void fiat_25519_to_bytes(uint8_t out1[32], const fiat_25519_tight_field_element arg1) {
  uint64_t x1;
  fiat_25519_uint1 x2;
  uint64_t x3;
  fiat_25519_uint1 x4;
  uint64_t x5;
  fiat_25519_uint1 x6;
  uint64_t x7;
  fiat_25519_uint1 x8;
  uint64_t x9;
  fiat_25519_uint1 x10;
  uint64_t x11;
  uint64_t x12;
  fiat_25519_uint1 x13;
  uint64_t x14;
  fiat_25519_uint1 x15;
  uint64_t x16;
  fiat_25519_uint1 x17;
  uint64_t x18;
  fiat_25519_uint1 x19;
  uint64_t x20;
  fiat_25519_uint1 x21;
  uint64_t x22;
  uint64_t x23;
  uint64_t x24;
  uint64_t x25;
  uint8_t x26;
  uint64_t x27;
  uint8_t x28;
  uint64_t x29;
  uint8_t x30;
  uint64_t x31;
  uint8_t x32;
  uint64_t x33;
  uint8_t x34;
  uint64_t x35;
  uint8_t x36;
  uint8_t x37;
  uint64_t x38;
  uint8_t x39;
  uint64_t x40;
  uint8_t x41;
  uint64_t x42;
  uint8_t x43;
  uint64_t x44;
  uint8_t x45;
  uint64_t x46;
  uint8_t x47;
  uint64_t x48;
  uint8_t x49;
  uint8_t x50;
  uint64_t x51;
  uint8_t x52;
  uint64_t x53;
  uint8_t x54;
  uint64_t x55;
  uint8_t x56;
  uint64_t x57;
  uint8_t x58;
  uint64_t x59;
  uint8_t x60;
  uint64_t x61;
  uint8_t x62;
  uint64_t x63;
  uint8_t x64;
  fiat_25519_uint1 x65;
  uint64_t x66;
  uint8_t x67;
  uint64_t x68;
  uint8_t x69;
  uint64_t x70;
  uint8_t x71;
  uint64_t x72;
  uint8_t x73;
  uint64_t x74;
  uint8_t x75;
  uint64_t x76;
  uint8_t x77;
  uint8_t x78;
  uint64_t x79;
  uint8_t x80;
  uint64_t x81;
  uint8_t x82;
  uint64_t x83;
  uint8_t x84;
  uint64_t x85;
  uint8_t x86;
  uint64_t x87;
  uint8_t x88;
  uint64_t x89;
  uint8_t x90;
  uint8_t x91;
  fiat_25519_subborrowx_u51(&x1, &x2, 0x0, (arg1[0]), UINT64_C(0x7ffffffffffed));
  fiat_25519_subborrowx_u51(&x3, &x4, x2, (arg1[1]), UINT64_C(0x7ffffffffffff));
  fiat_25519_subborrowx_u51(&x5, &x6, x4, (arg1[2]), UINT64_C(0x7ffffffffffff));
  fiat_25519_subborrowx_u51(&x7, &x8, x6, (arg1[3]), UINT64_C(0x7ffffffffffff));
  fiat_25519_subborrowx_u51(&x9, &x10, x8, (arg1[4]), UINT64_C(0x7ffffffffffff));
  fiat_25519_cmovznz_u64(&x11, x10, 0x0, UINT64_C(0xffffffffffffffff));
  fiat_25519_addcarryx_u51(&x12, &x13, 0x0, x1, (x11 & UINT64_C(0x7ffffffffffed)));
  fiat_25519_addcarryx_u51(&x14, &x15, x13, x3, (x11 & UINT64_C(0x7ffffffffffff)));
  fiat_25519_addcarryx_u51(&x16, &x17, x15, x5, (x11 & UINT64_C(0x7ffffffffffff)));
  fiat_25519_addcarryx_u51(&x18, &x19, x17, x7, (x11 & UINT64_C(0x7ffffffffffff)));
  fiat_25519_addcarryx_u51(&x20, &x21, x19, x9, (x11 & UINT64_C(0x7ffffffffffff)));
  x22 = (x20 << 4);
  x23 = (x18 * (uint64_t)0x2);
  x24 = (x16 << 6);
  x25 = (x14 << 3);
  x26 = (uint8_t)(x12 & UINT8_C(0xff));
  x27 = (x12 >> 8);
  x28 = (uint8_t)(x27 & UINT8_C(0xff));
  x29 = (x27 >> 8);
  x30 = (uint8_t)(x29 & UINT8_C(0xff));
  x31 = (x29 >> 8);
  x32 = (uint8_t)(x31 & UINT8_C(0xff));
  x33 = (x31 >> 8);
  x34 = (uint8_t)(x33 & UINT8_C(0xff));
  x35 = (x33 >> 8);
  x36 = (uint8_t)(x35 & UINT8_C(0xff));
  x37 = (uint8_t)(x35 >> 8);
  x38 = (x25 + (uint64_t)x37);
  x39 = (uint8_t)(x38 & UINT8_C(0xff));
  x40 = (x38 >> 8);
  x41 = (uint8_t)(x40 & UINT8_C(0xff));
  x42 = (x40 >> 8);
  x43 = (uint8_t)(x42 & UINT8_C(0xff));
  x44 = (x42 >> 8);
  x45 = (uint8_t)(x44 & UINT8_C(0xff));
  x46 = (x44 >> 8);
  x47 = (uint8_t)(x46 & UINT8_C(0xff));
  x48 = (x46 >> 8);
  x49 = (uint8_t)(x48 & UINT8_C(0xff));
  x50 = (uint8_t)(x48 >> 8);
  x51 = (x24 + (uint64_t)x50);
  x52 = (uint8_t)(x51 & UINT8_C(0xff));
  x53 = (x51 >> 8);
  x54 = (uint8_t)(x53 & UINT8_C(0xff));
  x55 = (x53 >> 8);
  x56 = (uint8_t)(x55 & UINT8_C(0xff));
  x57 = (x55 >> 8);
  x58 = (uint8_t)(x57 & UINT8_C(0xff));
  x59 = (x57 >> 8);
  x60 = (uint8_t)(x59 & UINT8_C(0xff));
  x61 = (x59 >> 8);
  x62 = (uint8_t)(x61 & UINT8_C(0xff));
  x63 = (x61 >> 8);
  x64 = (uint8_t)(x63 & UINT8_C(0xff));
  x65 = (fiat_25519_uint1)(x63 >> 8);
  x66 = (x23 + (uint64_t)x65);
  x67 = (uint8_t)(x66 & UINT8_C(0xff));
  x68 = (x66 >> 8);
  x69 = (uint8_t)(x68 & UINT8_C(0xff));
  x70 = (x68 >> 8);
  x71 = (uint8_t)(x70 & UINT8_C(0xff));
  x72 = (x70 >> 8);
  x73 = (uint8_t)(x72 & UINT8_C(0xff));
  x74 = (x72 >> 8);
  x75 = (uint8_t)(x74 & UINT8_C(0xff));
  x76 = (x74 >> 8);
  x77 = (uint8_t)(x76 & UINT8_C(0xff));
  x78 = (uint8_t)(x76 >> 8);
  x79 = (x22 + (uint64_t)x78);
  x80 = (uint8_t)(x79 & UINT8_C(0xff));
  x81 = (x79 >> 8);
  x82 = (uint8_t)(x81 & UINT8_C(0xff));
  x83 = (x81 >> 8);
  x84 = (uint8_t)(x83 & UINT8_C(0xff));
  x85 = (x83 >> 8);
  x86 = (uint8_t)(x85 & UINT8_C(0xff));
  x87 = (x85 >> 8);
  x88 = (uint8_t)(x87 & UINT8_C(0xff));
  x89 = (x87 >> 8);
  x90 = (uint8_t)(x89 & UINT8_C(0xff));
  x91 = (uint8_t)(x89 >> 8);
  out1[0] = x26;
  out1[1] = x28;
  out1[2] = x30;
  out1[3] = x32;
  out1[4] = x34;
  out1[5] = x36;
  out1[6] = x39;
  out1[7] = x41;
  out1[8] = x43;
  out1[9] = x45;
  out1[10] = x47;
  out1[11] = x49;
  out1[12] = x52;
  out1[13] = x54;
  out1[14] = x56;
  out1[15] = x58;
  out1[16] = x60;
  out1[17] = x62;
  out1[18] = x64;
  out1[19] = x67;
  out1[20] = x69;
  out1[21] = x71;
  out1[22] = x73;
  out1[23] = x75;
  out1[24] = x77;
  out1[25] = x80;
  out1[26] = x82;
  out1[27] = x84;
  out1[28] = x86;
  out1[29] = x88;
  out1[30] = x90;
  out1[31] = x91;
}